

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O1

int compress_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ssize_t avail;
  ssize_t sStack_8;
  
  pcVar3 = (char *)__archive_read_filter_ahead(filter,3,&sStack_8);
  iVar1 = 0;
  iVar2 = 0;
  if ((((pcVar3 != (char *)0x0) && (iVar2 = iVar1, *pcVar3 == '\x1f')) && (pcVar3[1] == -99)) &&
     (((pcVar3[2] & 0x20U) == 0 && (iVar2 = 0x12, (pcVar3[2] & 0x40U) != 0)))) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
compress_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	/* Shortest valid compress file is 3 bytes. */
	buffer = __archive_read_filter_ahead(filter, 3, &avail);

	if (buffer == NULL)
		return (0);

	bits_checked = 0;
	/* First two bytes are the magic value */
	if (buffer[0] != 0x1F || buffer[1] != 0x9D)
		return (0);
	/* Third byte holds compression parameters. */
	if (buffer[2] & 0x20) /* Reserved bit, must be zero. */
		return (0);
	if (buffer[2] & 0x40) /* Reserved bit, must be zero. */
		return (0);
	bits_checked += 18;

	return (bits_checked);
}